

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.h
# Opt level: O0

int __thiscall TreeNode::pathIndex(TreeNode *this,QString *filepath)

{
  int iVar1;
  int *piVar2;
  QString *in_RSI;
  long in_FS_OFFSET;
  int Uindex;
  int Windex;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int local_4c;
  char *in_stack_ffffffffffffffb8;
  int local_2c;
  undefined1 local_28 [28];
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString((QString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                   in_stack_ffffffffffffffb8);
  iVar1 = QString::indexOf(in_RSI,(longlong)local_28,CaseInsensitive);
  QString::~QString((QString *)0x27f507);
  local_c = iVar1;
  QString::QString((QString *)CONCAT44(iVar1,in_stack_ffffffffffffff88),in_stack_ffffffffffffffb8);
  local_4c = QString::indexOf(in_RSI,(longlong)&stack0xffffffffffffffb8,CaseInsensitive);
  QString::~QString((QString *)0x27f550);
  local_2c = local_4c;
  if ((local_c == -1) || (local_4c == -1)) {
    if (local_c != -1) {
      local_4c = local_c;
    }
  }
  else {
    piVar2 = qMin<int>(&local_c,&local_2c);
    local_4c = *piVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_4c;
}

Assistant:

int pathIndex(const QString &filepath) {
        int Windex = filepath.indexOf("\\");
        int Uindex = filepath.indexOf("/");
        if (Windex != -1 && Uindex != -1)
            return qMin(Windex, Uindex);
        else if (Windex != -1)
            return Windex;
        return Uindex;
    }